

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O0

VkResult vkb::create_debug_utils_messenger
                   (VkInstance instance,PFN_vkDebugUtilsMessengerCallbackEXT debug_callback,
                   VkDebugUtilsMessageSeverityFlagsEXT severity,VkDebugUtilsMessageTypeFlagsEXT type
                   ,void *user_data_pointer,VkDebugUtilsMessengerEXT *pDebugMessenger,
                   VkAllocationCallbacks *allocation_callbacks)

{
  VulkanFunctions *pVVar1;
  undefined1 local_68 [8];
  VkDebugUtilsMessengerCreateInfoEXT messengerCreateInfo;
  VkDebugUtilsMessengerEXT *pDebugMessenger_local;
  void *user_data_pointer_local;
  VkDebugUtilsMessageTypeFlagsEXT type_local;
  VkDebugUtilsMessageSeverityFlagsEXT severity_local;
  PFN_vkDebugUtilsMessengerCallbackEXT debug_callback_local;
  VkInstance instance_local;
  
  _type_local = debug_callback;
  if (debug_callback == (PFN_vkDebugUtilsMessengerCallbackEXT)0x0) {
    _type_local = default_debug_callback;
  }
  messengerCreateInfo.pUserData = pDebugMessenger;
  memset(local_68,0,0x30);
  local_68._0_4_ = VK_STRUCTURE_TYPE_DEBUG_UTILS_MESSENGER_CREATE_INFO_EXT;
  messengerCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  messengerCreateInfo._4_4_ = 0;
  messengerCreateInfo._24_8_ = _type_local;
  messengerCreateInfo.pNext._4_4_ = severity;
  messengerCreateInfo.flags = type;
  messengerCreateInfo.pfnUserCallback = (PFN_vkDebugUtilsMessengerCallbackEXT)user_data_pointer;
  pVVar1 = detail::vulkan_functions();
  if (pVVar1->fp_vkCreateDebugUtilsMessengerEXT == (PFN_vkCreateDebugUtilsMessengerEXT)0x0) {
    instance_local._4_4_ = VK_ERROR_EXTENSION_NOT_PRESENT;
  }
  else {
    pVVar1 = detail::vulkan_functions();
    instance_local._4_4_ =
         (*pVVar1->fp_vkCreateDebugUtilsMessengerEXT)
                   (instance,(VkDebugUtilsMessengerCreateInfoEXT *)local_68,allocation_callbacks,
                    (VkDebugUtilsMessengerEXT *)messengerCreateInfo.pUserData);
  }
  return instance_local._4_4_;
}

Assistant:

VkResult create_debug_utils_messenger(VkInstance instance,
    PFN_vkDebugUtilsMessengerCallbackEXT debug_callback,
    VkDebugUtilsMessageSeverityFlagsEXT severity,
    VkDebugUtilsMessageTypeFlagsEXT type,
    void* user_data_pointer,
    VkDebugUtilsMessengerEXT* pDebugMessenger,
    VkAllocationCallbacks* allocation_callbacks) {

    if (debug_callback == nullptr) debug_callback = default_debug_callback;
    VkDebugUtilsMessengerCreateInfoEXT messengerCreateInfo = {};
    messengerCreateInfo.sType = VK_STRUCTURE_TYPE_DEBUG_UTILS_MESSENGER_CREATE_INFO_EXT;
    messengerCreateInfo.pNext = nullptr;
    messengerCreateInfo.messageSeverity = severity;
    messengerCreateInfo.messageType = type;
    messengerCreateInfo.pfnUserCallback = debug_callback;
    messengerCreateInfo.pUserData = user_data_pointer;

    if (detail::vulkan_functions().fp_vkCreateDebugUtilsMessengerEXT != nullptr) {
        return detail::vulkan_functions().fp_vkCreateDebugUtilsMessengerEXT(
            instance, &messengerCreateInfo, allocation_callbacks, pDebugMessenger);
    } else {
        return VK_ERROR_EXTENSION_NOT_PRESENT;
    }
}